

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveCardsOperationSnapshotCreator.cpp
# Opt level: O0

void __thiscall
solitaire::archivers::MoveCardsOperationSnapshotCreator::restoreSourcePile
          (MoveCardsOperationSnapshotCreator *this)

{
  pointer pSVar1;
  MoveCardsOperationSnapshotCreator *this_local;
  
  throwIfSourcePileSnapshotIsNullptr(this);
  pSVar1 = std::
           unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
           ::operator->(&this->sourcePileSnapshot);
  (*pSVar1->_vptr_Snapshot[2])();
  std::
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  ::operator=(&this->sourcePileSnapshot,(nullptr_t)0x0);
  return;
}

Assistant:

void MoveCardsOperationSnapshotCreator::restoreSourcePile() {
    throwIfSourcePileSnapshotIsNullptr();
    sourcePileSnapshot->restore();
    sourcePileSnapshot = nullptr;
}